

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Err * parse(VM *vm,int pkg,char *path,char *code)

{
  int iVar1;
  undefined1 local_98 [8];
  Parser psr;
  char *code_local;
  char *path_local;
  int pkg_local;
  VM *vm_local;
  
  psr._104_8_ = code;
  psr_new((Parser *)local_98,vm,pkg,path,code);
  vm->err = (Err *)0x0;
  iVar1 = _setjmp((__jmp_buf_tag *)vm->guard);
  if (iVar1 == 0) {
    parse_code((Parser *)local_98);
  }
  psr_free((Parser *)local_98);
  return vm->err;
}

Assistant:

Err * parse(VM *vm, int pkg, char *path, char *code) {
	Parser psr = psr_new(vm, pkg, path, code);

	// Set up an error guard
	vm->err = NULL;
	if (!setjmp(vm->guard)) {
		parse_code(&psr);
	}

	psr_free(&psr);
	return vm->err;
}